

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

void __thiscall iDynTree::Box::~Box(Box *this)

{
  (this->super_SolidShape)._vptr_SolidShape = (_func_int **)&PTR___cxa_pure_virtual_001e6620;
  Material::~Material(&(this->super_SolidShape).m_material);
  std::__cxx11::string::~string((string *)&(this->super_SolidShape).name);
  return;
}

Assistant:

SolidShape::~SolidShape()
    {
    }